

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O3

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  z_Bytef *pzVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  internal_state *piVar12;
  long lVar13;
  Posf *pPVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  undefined4 uVar18;
  long lVar19;
  z_Bytef *pzVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  Posf PVar24;
  uint uVar25;
  z_Bytef *pzVar26;
  z_Bytef *pzVar27;
  uint uVar28;
  uint uVar29;
  z_Bytef *pzVar30;
  long lVar31;
  int local_38;
  
  piVar12 = strm->state;
  pzVar26 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pzVar20 = strm->next_in + -1;
  pzVar27 = strm->next_out + -1;
  local_38 = (int)pzVar27 - (start - strm->avail_out);
  pzVar30 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar9 = piVar12->wrap;
  uVar10 = *(uint *)&piVar12->gzhead;
  uVar11 = *(uint *)((long)&piVar12->gzhead + 4);
  lVar21 = *(long *)&piVar12->gzindex;
  uVar28 = piVar12->last_flush;
  uVar15 = piVar12->w_size;
  bVar4 = *(byte *)&piVar12->head;
  bVar5 = *(byte *)((long)&piVar12->head + 4);
  lVar13 = *(long *)&piVar12->window_size;
  pPVar14 = piVar12->prev;
LAB_00695f51:
  if (uVar15 < 0xf) {
    pbVar1 = pzVar20 + 1;
    pbVar2 = pzVar20 + 2;
    pzVar20 = pzVar20 + 2;
    uVar28 = ((uint)*pbVar2 << ((byte)uVar15 + 8 & 0x1f)) +
             ((uint)*pbVar1 << ((byte)uVar15 & 0x1f)) + uVar28;
    uVar15 = uVar15 | 0x10;
  }
  uVar22 = uVar28 & ~(-1 << (bVar4 & 0x1f));
  while( true ) {
    uVar16 = (ulong)uVar22;
    bVar6 = *(byte *)(lVar13 + 1 + uVar16 * 4);
    uVar28 = uVar28 >> (bVar6 & 0x1f);
    bVar7 = *(byte *)(lVar13 + uVar16 * 4);
    uVar8 = *(ushort *)(lVar13 + 2 + uVar16 * 4);
    uVar15 = uVar15 - bVar6;
    if (bVar7 == 0) break;
    if ((bVar7 & 0x10) != 0) {
      uVar29 = (uint)uVar8;
      uVar22 = bVar7 & 0xf;
      if ((bVar7 & 0xf) != 0) {
        if (uVar15 < uVar22) {
          pbVar1 = pzVar20 + 1;
          pzVar20 = pzVar20 + 1;
          uVar28 = uVar28 + ((uint)*pbVar1 << ((byte)uVar15 & 0x1f));
          uVar15 = uVar15 + 8;
        }
        uVar29 = (uint)uVar8 + (~(-1 << (sbyte)uVar22) & uVar28);
        uVar28 = uVar28 >> (sbyte)uVar22;
        uVar15 = uVar15 - uVar22;
      }
      if (uVar15 < 0xf) {
        pbVar1 = pzVar20 + 1;
        pbVar2 = pzVar20 + 2;
        pzVar20 = pzVar20 + 2;
        uVar28 = ((uint)*pbVar2 << ((byte)uVar15 + 8 & 0x1f)) +
                 ((uint)*pbVar1 << ((byte)uVar15 & 0x1f)) + uVar28;
        uVar15 = uVar15 | 0x10;
      }
      uVar16 = (ulong)(uVar28 & ~(-1 << (bVar5 & 0x1f)));
      bVar7 = (byte)pPVar14[uVar16 * 2];
      bVar6 = *(byte *)((long)pPVar14 + uVar16 * 4 + 1);
      PVar24 = pPVar14[uVar16 * 2 + 1];
      uVar28 = uVar28 >> (bVar6 & 0x1f);
      uVar15 = uVar15 - bVar6;
      goto LAB_00696060;
    }
    if ((bVar7 & 0x40) != 0) {
      uVar18 = 0xb;
      if ((bVar7 & 0x20) != 0) goto LAB_0069633a;
      pcVar17 = "invalid literal/length code";
      goto LAB_00696331;
    }
    uVar22 = (~(-1 << (bVar7 & 0x1f)) & uVar28) + (uint)uVar8;
  }
  pzVar27[1] = (z_Bytef)uVar8;
  pzVar27 = pzVar27 + 1;
  goto LAB_00695fc0;
LAB_00696060:
  if ((bVar7 & 0x10) != 0) goto LAB_0069609d;
  if ((bVar7 & 0x40) != 0) {
    pcVar17 = "invalid distance code";
    goto LAB_00696331;
  }
  uVar16 = (ulong)((~(-1 << (bVar7 & 0x1f)) & uVar28) + (uint)PVar24);
  bVar6 = *(byte *)((long)pPVar14 + uVar16 * 4 + 1);
  uVar28 = uVar28 >> (bVar6 & 0x1f);
  bVar7 = (byte)pPVar14[uVar16 * 2];
  PVar24 = pPVar14[uVar16 * 2 + 1];
  uVar15 = uVar15 - bVar6;
  goto LAB_00696060;
LAB_0069609d:
  uVar22 = bVar7 & 0xf;
  if (uVar15 < uVar22) {
    uVar28 = ((uint)pzVar20[1] << ((byte)uVar15 & 0x1f)) + uVar28;
    uVar23 = uVar15 + 8;
    if (uVar23 < uVar22) {
      pbVar1 = pzVar20 + 2;
      pzVar20 = pzVar20 + 2;
      uVar28 = uVar28 + ((uint)*pbVar1 << ((byte)uVar23 & 0x1f));
      uVar15 = uVar15 + 0x10;
    }
    else {
      pzVar20 = pzVar20 + 1;
      uVar15 = uVar23;
    }
  }
  uVar23 = (~(-1 << (sbyte)uVar22) & uVar28) + (uint)PVar24;
  uVar28 = uVar28 >> (sbyte)uVar22;
  uVar15 = uVar15 - uVar22;
  uVar22 = (int)pzVar27 - local_38;
  uVar25 = uVar23 - uVar22;
  if (uVar23 < uVar22 || uVar25 == 0) {
    uVar16 = (ulong)uVar23;
    lVar31 = 0;
    uVar22 = uVar29;
    do {
      lVar19 = lVar31;
      pzVar27[lVar19 + 1] = pzVar27[lVar19 + (1 - uVar16)];
      pzVar27[lVar19 + 2] = pzVar27[lVar19 + (2 - uVar16)];
      pzVar27[lVar19 + 3] = pzVar27[lVar19 + (3 - uVar16)];
      uVar22 = uVar22 - 3;
      lVar31 = lVar19 + 3;
    } while (2 < uVar22);
    if ((uint)lVar31 == uVar29) {
      pzVar27 = pzVar27 + lVar31;
    }
    else {
      pzVar27[lVar19 + 4] = pzVar27[-uVar16 + 1 + lVar31];
      if ((uint)lVar31 - uVar29 == -2) {
        pzVar3 = pzVar27 + -uVar16 + 2 + lVar31;
        pzVar27 = pzVar27 + lVar19 + 5;
        *pzVar27 = *pzVar3;
      }
      else {
        pzVar27 = pzVar27 + lVar19 + 4;
      }
    }
    goto LAB_00695fc0;
  }
  if (uVar10 < uVar25) {
    pcVar17 = "invalid distance too far back";
LAB_00696331:
    strm->msg = pcVar17;
    uVar18 = 0x1b;
LAB_0069633a:
    *(undefined4 *)&piVar12->strm = uVar18;
LAB_0069633d:
    lVar21 = (long)pzVar20 - (ulong)(uVar15 >> 3);
    strm->next_in = (z_Bytef *)(lVar21 + 1);
    strm->next_out = pzVar27 + 1;
    strm->avail_in = ((int)pzVar26 - (int)lVar21) + 5;
    strm->avail_out = ((int)pzVar30 - (int)pzVar27) + 0x101;
    piVar12->last_flush = ~(-1 << (sbyte)(uVar15 & 7)) & uVar28;
    piVar12->w_size = uVar15 & 7;
    return;
  }
  if (uVar11 == 0) {
    uVar16 = (ulong)(iVar9 - uVar25);
    uVar22 = uVar29 - uVar25;
    if (uVar29 < uVar25 || uVar22 == 0) goto LAB_00696271;
    lVar31 = 0;
    do {
      pzVar27[1] = *(z_Bytef *)(uVar16 + lVar21 + lVar31);
      pzVar27 = pzVar27 + 1;
      lVar31 = lVar31 + 1;
    } while (uVar25 != (uint)lVar31);
LAB_00696264:
    lVar31 = (long)pzVar27 - (ulong)uVar23;
  }
  else {
    if (uVar11 < uVar25) {
      uVar16 = (ulong)((uVar11 + iVar9) - uVar25);
      uVar25 = uVar25 - uVar11;
      uVar22 = uVar29 - uVar25;
      if (uVar25 <= uVar29 && uVar22 != 0) {
        lVar31 = 0;
        do {
          pzVar27[lVar31 + 1] = *(z_Bytef *)(uVar16 + lVar21 + lVar31);
          lVar31 = lVar31 + 1;
        } while (uVar25 != (uint)lVar31);
        pzVar27 = pzVar27 + lVar31;
        lVar31 = lVar21 + -1;
        if (uVar11 < uVar22) {
          lVar31 = 0;
          do {
            pzVar27[1] = *(z_Bytef *)(lVar21 + lVar31);
            pzVar27 = pzVar27 + 1;
            lVar31 = lVar31 + 1;
          } while (uVar11 != (uint)lVar31);
          uVar22 = uVar22 - uVar11;
          goto LAB_00696264;
        }
        goto joined_r0x0069627a;
      }
    }
    else {
      uVar16 = (ulong)(uVar11 - uVar25);
      uVar22 = uVar29 - uVar25;
      if (uVar25 <= uVar29 && uVar22 != 0) {
        lVar31 = 0;
        do {
          pzVar27[1] = *(z_Bytef *)(uVar16 + lVar21 + lVar31);
          pzVar27 = pzVar27 + 1;
          lVar31 = lVar31 + 1;
        } while (uVar25 != (uint)lVar31);
        goto LAB_00696264;
      }
    }
LAB_00696271:
    lVar31 = uVar16 + lVar21 + -1;
    uVar22 = uVar29;
  }
joined_r0x0069627a:
  for (; 2 < uVar22; uVar22 = uVar22 - 3) {
    pzVar27[1] = *(z_Bytef *)(lVar31 + 1);
    pzVar27[2] = *(z_Bytef *)(lVar31 + 2);
    pzVar27[3] = *(z_Bytef *)(lVar31 + 3);
    pzVar27 = pzVar27 + 3;
    lVar31 = lVar31 + 3;
  }
  if (uVar22 != 0) {
    pzVar27[1] = *(z_Bytef *)(lVar31 + 1);
    if (uVar22 == 2) {
      pzVar27[2] = *(z_Bytef *)(lVar31 + 2);
      pzVar27 = pzVar27 + 2;
    }
    else {
      pzVar27 = pzVar27 + 1;
    }
  }
LAB_00695fc0:
  if ((pzVar26 <= pzVar20) || (pzVar30 <= pzVar27)) goto LAB_0069633d;
  goto LAB_00695f51;
}

Assistant:

void inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned write;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned int hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code this;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    write = state->write;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned int)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned int)(PUP(in)) << bits;
            bits += 8;
        }
        this = lcode[hold & lmask];
      dolen:
        op = (unsigned)(this.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(this.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, this.val >= 0x20 && this.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", this.val));
            PUP(out) = (unsigned char)(this.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(this.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned int)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned int)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned int)(PUP(in)) << bits;
                bits += 8;
            }
            this = dcode[hold & dmask];
          dodist:
            op = (unsigned)(this.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(this.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(this.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned int)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned int)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        strm->msg = (char *)"invalid distance too far back";
                        state->mode = BAD;
                        break;
                    }
                    from = window - OFF;
                    if (write == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (write < op) {      /* wrap around window */
                        from += wsize + write - op;
                        op -= write;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (write < len) {  /* some from start of window */
                                op = write;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += write - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                this = dcode[this.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            this = lcode[this.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}